

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O0

wstring * JSONValue::Indent_abi_cxx11_(size_t depth)

{
  ulong uVar1;
  long in_RSI;
  wstring *in_RDI;
  size_t indent_step;
  wstring *indentStr;
  allocator local_1a;
  undefined1 local_19;
  undefined8 local_18;
  long local_10;
  
  local_18 = 2;
  if (in_RSI == 0) {
    local_10 = 0;
  }
  else {
    local_10 = in_RSI + -1;
  }
  local_19 = 0;
  uVar1 = local_10 * 2;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(in_RDI,uVar1,L' ',&local_1a);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_1a);
  return in_RDI;
}

Assistant:

std::wstring JSONValue::Indent(size_t depth)
{
	const size_t indent_step = 2;
	depth ? --depth : 0;
	std::wstring indentStr(depth * indent_step, ' ');
	return indentStr;
}